

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O1

int __thiscall btSparseSdf<3>::RemoveReferences(btSparseSdf<3> *this,btCollisionShape *pcs)

{
  Cell **ppCVar1;
  Cell *pCVar2;
  Cell **ppCVar3;
  int iVar4;
  Cell *pCVar5;
  Cell *pCVar6;
  Cell *pCVar7;
  long lVar8;
  
  if ((this->cells).m_size < 1) {
    iVar4 = 0;
  }
  else {
    lVar8 = 0;
    iVar4 = 0;
    do {
      ppCVar1 = (this->cells).m_data;
      pCVar5 = ppCVar1[lVar8];
      if (pCVar5 != (Cell *)0x0) {
        pCVar6 = (Cell *)0x0;
        do {
          pCVar2 = pCVar5->next;
          pCVar7 = pCVar5;
          if (pCVar5->pclient == pcs) {
            ppCVar3 = &pCVar6->next;
            if (pCVar6 == (Cell *)0x0) {
              ppCVar3 = ppCVar1 + lVar8;
            }
            *ppCVar3 = pCVar2;
            operator_delete(pCVar5);
            iVar4 = iVar4 + 1;
            pCVar7 = pCVar6;
          }
          pCVar5 = pCVar2;
          pCVar6 = pCVar7;
        } while (pCVar2 != (Cell *)0x0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->cells).m_size);
  }
  return iVar4;
}

Assistant:

int						RemoveReferences(btCollisionShape* pcs)
	{
		int	refcount=0;
		for(int i=0;i<cells.size();++i)
		{
			Cell*&	root=cells[i];
			Cell*	pp=0;
			Cell*	pc=root;
			while(pc)
			{
				Cell*	pn=pc->next;
				if(pc->pclient==pcs)
				{
					if(pp) pp->next=pn; else root=pn;
					delete pc;pc=pp;++refcount;
				}
				pp=pc;pc=pn;
			}
		}
		return(refcount);
	}